

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::CompactReporter::noMatchingTestCases(CompactReporter *this,string *spec)

{
  ostream *poVar1;
  string *spec_local;
  CompactReporter *this_local;
  
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,"No test cases matched \'");
  poVar1 = std::operator<<(poVar1,(string *)spec);
  poVar1 = std::operator<<(poVar1,'\'');
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CompactReporter::noMatchingTestCases(std::string const &spec) {
        stream << "No test cases matched '" << spec << '\'' << std::endl;
    }